

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::framebufferTexture2D
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 textarget,
          deUint32 texture,int level)

{
  Framebuffer *pFVar1;
  Framebuffer *pFVar2;
  Texture *pTVar3;
  TestError *this_00;
  TexTarget TVar4;
  int iVar5;
  Framebuffer *pFVar6;
  TexTarget TVar7;
  TexTarget TVar8;
  int iVar9;
  Attachment *attachment_00;
  bool bVar10;
  bool bVar11;
  long lStack_60;
  
  if (attachment == 0x8d20) {
    lStack_60 = 2;
LAB_0152a708:
    bVar10 = false;
  }
  else if (attachment == 0x8ce0) {
    bVar10 = false;
    lStack_60 = 0;
  }
  else {
    if (attachment == 0x8d00) {
      lStack_60 = 1;
      goto LAB_0152a708;
    }
    if (attachment == 0x821a) {
      (*(this->super_Context)._vptr_Context[0x1e])
                (this,(ulong)target,0x8d00,(ulong)textarget,(ulong)texture,(ulong)(uint)level);
      (*(this->super_Context)._vptr_Context[0x1e])
                (this,(ulong)target,0x8d20,(ulong)textarget,(ulong)texture,(ulong)(uint)level);
      return;
    }
    lStack_60 = 3;
    bVar10 = true;
  }
  switch(textarget) {
  case 0x8515:
    TVar4 = TEXTARGET_CUBE_MAP_POSITIVE_X;
    bVar11 = false;
    TVar7 = TVar4;
    TVar8 = TVar4;
    goto LAB_0152a77e;
  case 0x8516:
    TVar4 = TEXTARGET_CUBE_MAP_NEGATIVE_X;
    break;
  case 0x8517:
    TVar4 = TEXTARGET_CUBE_MAP_POSITIVE_Y;
    break;
  case 0x8518:
    TVar4 = TEXTARGET_CUBE_MAP_NEGATIVE_Y;
    break;
  case 0x8519:
    TVar4 = TEXTARGET_CUBE_MAP_POSITIVE_Z;
    break;
  case 0x851a:
    TVar4 = TEXTARGET_CUBE_MAP_NEGATIVE_Z;
    break;
  default:
    if (textarget == 0xde1) {
      bVar11 = true;
      TVar4 = TEXTARGET_2D;
      TVar7 = TEXTARGET_CUBE_MAP_POSITIVE_X;
      TVar8 = TEXTARGET_2D;
    }
    else {
      TVar4 = TEXTARGET_LAST;
      bVar11 = false;
      TVar7 = TEXTARGET_2D;
      TVar8 = TEXTARGET_CUBE_MAP_POSITIVE_X;
    }
    goto LAB_0152a77e;
  }
  bVar11 = false;
  TVar7 = TEXTARGET_CUBE_MAP_POSITIVE_X;
  TVar8 = TEXTARGET_CUBE_MAP_POSITIVE_X;
LAB_0152a77e:
  if (((1 < target - 0x8ca8) && (target != 0x8d40)) || (bVar10)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  pFVar1 = this->m_readFramebufferBinding;
  pFVar2 = this->m_drawFramebufferBinding;
  pFVar6 = pFVar1;
  if (target == 0x8ca9) {
    pFVar6 = pFVar2;
  }
  if (target == 0x8d40) {
    pFVar6 = pFVar2;
  }
  if (pFVar6 != (Framebuffer *)0x0) {
    if (texture == 0) {
      pTVar3 = (Texture *)0x0;
LAB_0152a85b:
      iVar9 = (uint)(pFVar6 == pFVar1) + (uint)(pFVar6 == pFVar2);
      attachment_00 = pFVar6->m_attachments + lStack_60;
      iVar5 = iVar9;
      while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
        releaseFboAttachmentReference(this,attachment_00);
      }
      attachment_00->type = ATTACHMENTTYPE_LAST;
      attachment_00->name = 0;
      pFVar6->m_attachments[lStack_60].texTarget = TEXTARGET_LAST;
      pFVar6->m_attachments[lStack_60].level = 0;
      pFVar6->m_attachments[lStack_60].layer = 0;
      if (pTVar3 == (Texture *)0x0) {
        return;
      }
      attachment_00->type = ATTACHMENTTYPE_TEXTURE;
      pFVar6->m_attachments[lStack_60].name = (pTVar3->super_NamedObject).m_name;
      pFVar6->m_attachments[lStack_60].texTarget = TVar4;
      pFVar6->m_attachments[lStack_60].level = level;
      while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
        acquireFboAttachmentReference(this,attachment_00);
      }
      return;
    }
    pTVar3 = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,texture);
    if (pTVar3 != (Texture *)0x0) {
      if (level != 0) {
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x501;
        return;
      }
      if (pTVar3->m_type == TYPE_CUBE_MAP) {
        bVar11 = (TVar7 & TVar8) == TEXTARGET_2D;
      }
      else {
        if (pTVar3->m_type != TYPE_2D) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,(char *)0x0,"texObj->getType() == Texture::TYPE_CUBE_MAP",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                     ,0x7d7);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        bVar11 = !bVar11;
      }
      if (!bVar11) goto LAB_0152a85b;
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x502;
  }
  return;
}

Assistant:

void ReferenceContext::framebufferTexture2D (deUint32 target, deUint32 attachment, deUint32 textarget, deUint32 texture, int level)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach to both depth and stencil.
		framebufferTexture2D(target, GL_DEPTH_ATTACHMENT,	textarget, texture, level);
		framebufferTexture2D(target, GL_STENCIL_ATTACHMENT,	textarget, texture, level);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Texture*						texObj			= DE_NULL;
		Framebuffer::TexTarget			fboTexTarget	= mapGLFboTexTarget(textarget);

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (texture != 0)
		{
			texObj = m_textures.find(texture);

			RC_IF_ERROR(!texObj,		GL_INVALID_OPERATION,	RC_RET_VOID);
			RC_IF_ERROR(level != 0,		GL_INVALID_VALUE,		RC_RET_VOID); // \todo [2012-03-19 pyry] We should allow other levels as well.

			if (texObj->getType() == Texture::TYPE_2D)
				RC_IF_ERROR(fboTexTarget != Framebuffer::TEXTARGET_2D, GL_INVALID_OPERATION, RC_RET_VOID);
			else
			{
				TCU_CHECK(texObj->getType() == Texture::TYPE_CUBE_MAP);
				if (!deInRange32(fboTexTarget, Framebuffer::TEXTARGET_CUBE_MAP_POSITIVE_X, Framebuffer::TEXTARGET_CUBE_MAP_NEGATIVE_Z))
					RC_ERROR_RET(GL_INVALID_OPERATION, RC_RET_VOID);
			}
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (texObj)
		{
			fboAttachment.type			= Framebuffer::ATTACHMENTTYPE_TEXTURE;
			fboAttachment.name			= texObj->getName();
			fboAttachment.texTarget		= fboTexTarget;
			fboAttachment.level			= level;

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}